

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

string * __thiscall
Parse::toCatName_abi_cxx11_(string *__return_storage_ptr__,Parse *this,Category cat)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *pcVar3;
  
  paVar1 = &__return_storage_ptr__->field_2;
  if (cat == FUNCTION) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    pcVar3 = "func";
    pcVar2 = "";
  }
  else if (cat == FORMALPARAM) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    pcVar3 = "vf";
    pcVar2 = "";
  }
  else if (cat == VARIABLE) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    pcVar3 = "var";
    pcVar2 = "";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    pcVar3 = "const";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string Parse::toCatName(Category cat) {
    if(cat == Category::VARIABLE) {
        return "var";
    } else if(cat == Category::FORMALPARAM) {
        return "vf";
    } else if(cat == Category::FUNCTION) {
        return "func";
    } else if(cat == Category::CONST) {
        return "const";
    }
}